

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::CharSetFull::ToEquivClass<char16_t>
          (CharSetFull *this,ArenaAllocator *allocator,uint level,uint base,uint *tblidx,
          CharSet<char16_t> *result,codepoint_t baseOffset)

{
  uint uVar1;
  Char lc;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  uint h;
  uint l;
  long lVar5;
  int iVar6;
  char16 local_58 [4];
  char16_t equivl [4];
  uint local_34 [2];
  uint acth;
  
  l = baseOffset + 0xff + base;
  if (level != 2) {
    l = baseOffset + base;
  }
  h = ~(-1 << ((char)level * '\x04' + 8U & 0x1f)) + baseOffset + base;
  equivl = (char16_t  [4])result;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  do {
    CaseInsensitive::RangeToEquivClass(tblidx,l,h,local_34,local_58);
    iVar6 = local_34[0] - l;
    lVar5 = 0;
    do {
      lc = local_58[lVar5];
      uVar1 = iVar6 + (uint)(ushort)lc;
      if (0xffff < uVar1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                           ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      CharSet<char16_t>::SetRange((CharSet<char16_t> *)equivl,allocator,lc,(Char)uVar1);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    l = local_34[0] + 1;
  } while (l <= h);
  return;
}

Assistant:

void CharSetFull::ToEquivClass(ArenaAllocator* allocator, uint level, uint base, uint& tblidx, CharSet<C>& result, codepoint_t baseOffset) const
    {
        uint l = base + (CharSetNode::levels - 1 == level ? 0xff : 0) + baseOffset;
        uint h = base + lim(level) + baseOffset;

        do
        {
            uint acth;
            C equivl[CaseInsensitive::EquivClassSize];
            CaseInsensitive::RangeToEquivClass(tblidx, l, h, acth, equivl);
            uint n = acth - l;
            for (int i = 0; i < CaseInsensitive::EquivClassSize; i++)
            {
                result.SetRange(allocator, equivl[i], Chars<C>::Shift(equivl[i], n));
            }

            // Go around again for rest of this range
            l = acth + 1;
        }
        while (l <= h);
    }